

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

void Bac_ManWriteConcat(Bac_Ntk_t *p,int iStart,int nObjs)

{
  Vec_Str_t *p_00;
  char cVar1;
  int iVar2;
  Bac_NameType_t BVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint Num;
  uint uVar10;
  
  if (nObjs < 1) {
    __assert_fail("nObjs >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x11e,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
  }
  if (nObjs == 1) {
    Bac_ManWriteSig(p,iStart);
    return;
  }
  p_00 = p->pDesign->vOut;
  Vec_StrPrintStr(p_00,"{");
  iVar2 = Bac_ObjIsBo(p,iStart);
  if (iVar2 == 0) {
    iVar2 = Bac_ObjIsBi(p,iStart);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                    ,0x187,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
    }
    iVar2 = (iStart - nObjs) + 1;
    while (iVar4 = iVar2, iVar4 <= iStart) {
      cVar1 = Vec_StrEntryLast(p_00);
      if (cVar1 != '{') {
        Vec_StrPrintStr(p_00,", ");
      }
      iVar2 = Bac_ObjFanin(p,iVar4);
      iVar2 = Bac_ObjGetConst(p,iVar2);
      if (iVar2 == 0) {
        for (iVar5 = 1; iVar2 = iVar4 + iVar5, iVar2 <= iStart; iVar5 = iVar5 + 1) {
          iVar7 = Bac_ObjFanin(p,iVar2);
          iVar6 = Bac_ObjFanin(p,iVar4);
          if (iVar7 != iVar6) break;
        }
        if (iVar4 + 2 < iVar2) {
          Vec_StrPrintNum(p_00,iVar5);
          Vec_StrPrintStr(p_00,"{");
          Bac_ManWriteSig(p,iVar4);
          Vec_StrPrintStr(p_00,"}");
        }
        else {
          iVar2 = Bac_ObjFanin(p,iVar4);
          iVar5 = Bac_ObjName(p,iVar2);
          BVar3 = Bac_NameType(iVar5);
          iVar2 = iVar4 + 1;
          if (BVar3 == BAC_NAME_BIN) {
            iVar5 = Abc_Lit2Var2(iVar5);
            Bac_ManWriteVar(p,iVar5);
          }
          else {
            iVar5 = 1;
            iVar7 = iVar4;
            while (iVar6 = iVar7 + 1, iVar6 <= iStart) {
              iVar8 = Bac_ObjFanin(p,iVar4);
              iVar9 = Bac_ObjFanin(p,iVar6);
              if (iVar5 != iVar8 - iVar9) break;
              iVar5 = iVar5 + 1;
              iVar7 = iVar6;
            }
            iVar6 = Bac_ObjFanin(p,iVar4);
            iVar6 = Bac_ManFindRealNameId(p,iVar6);
            Bac_ManWriteVar(p,iVar6);
            if (iVar5 == 1) {
              iVar5 = Bac_ObjFanin(p,iVar4);
              iVar5 = Bac_ManFindRealIndex(p,iVar5);
              Bac_ManWriteRange(p,iVar5,-1);
            }
            else {
              iVar6 = Bac_ObjFanin(p,iVar7);
              BVar3 = Bac_ObjNameType(p,iVar6);
              if (BVar3 == BAC_NAME_BIN) {
                __assert_fail("Bac_ObjNameType(p, f) != BAC_NAME_BIN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x17f,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
              }
              BVar3 = Bac_ObjNameType(p,iVar6);
              iVar2 = iVar7 + 1;
              if ((BVar3 == BAC_NAME_INDEX) || (iVar8 = Bac_ObjGetRange(p,iVar6), iVar8 != iVar5)) {
                iVar5 = Bac_ManFindRealIndex(p,iVar6);
                iVar4 = Bac_ObjFanin(p,iVar4);
                iVar4 = Bac_ManFindRealIndex(p,iVar4);
                Bac_ManWriteRange(p,iVar5,iVar4);
              }
            }
          }
        }
      }
      else {
        iVar2 = Bac_ObjFanin(p,iVar4);
        iVar5 = Bac_ObjIsConstBin(p,iVar2 + -1);
        Num = 1;
        iVar7 = iVar4;
        while (iVar2 = iVar7 + 1, iVar7 < iStart) {
          iVar6 = Bac_ObjFanin(p,iVar2);
          iVar6 = Bac_ObjGetConst(p,iVar6);
          if (iVar6 == 0) break;
          iVar7 = Bac_ObjFanin(p,iVar2);
          iVar7 = Bac_ObjIsConstBin(p,iVar7 + -1);
          if (iVar7 == 0) {
            iVar5 = 0;
          }
          Num = Num + 1;
          iVar7 = iVar2;
        }
        Vec_StrPrintNum(p_00,Num);
        if ((int)Num < 9 || iVar5 == 0) {
          Vec_StrPrintStr(p_00,"\'b");
          for (; iVar4 <= iVar7; iVar4 = iVar4 + 1) {
            iVar5 = Bac_ObjFanin(p,iVar4);
            Bac_ManWriteConstBit(p,iVar5,0);
          }
        }
        else {
          uVar10 = Num & 3;
          if ((Num & 3) == 0) {
            uVar10 = 4;
          }
          Vec_StrPrintStr(p_00,"\'h");
          iVar5 = 0;
          for (; iVar4 <= iVar7; iVar4 = iVar4 + 1) {
            iVar6 = Bac_ObjFanin(p,iVar4);
            iVar6 = Bac_ObjGetConst(p,iVar6);
            iVar5 = iVar6 + iVar5 * 2;
            if (0x15 < iVar5) {
              __assert_fail("Digit < 16",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x14b,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
            }
            uVar10 = uVar10 - 1;
            if (uVar10 == 0) {
              cVar1 = (char)iVar5 + '*';
              if (0xf < iVar5) {
                cVar1 = (char)iVar5 + 'Q';
              }
              Vec_StrPush(p_00,cVar1);
              iVar5 = 0;
              uVar10 = 4;
            }
            else {
              iVar5 = iVar5 + -6;
            }
          }
          if (uVar10 != 4) {
            __assert_fail("nBits == 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                          ,0x153,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
          }
          if (iVar5 != 0) {
            __assert_fail("Digit == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                          ,0x154,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
          }
        }
      }
    }
  }
  else {
    iVar2 = nObjs + iStart;
    while (iStart < iVar2) {
      iVar2 = iVar2 + -1;
      BVar3 = Bac_ObjNameType(p,iVar2);
      if (BVar3 != BAC_NAME_INDEX) {
        cVar1 = Vec_StrEntryLast(p_00);
        if (cVar1 != '{') {
          Vec_StrPrintStr(p_00,", ");
        }
        iVar4 = Bac_ManFindRealNameId(p,iVar2);
        Bac_ManWriteVar(p,iVar4);
      }
    }
  }
  Vec_StrPrintStr(p_00,"}");
  return;
}

Assistant:

static inline void Bac_ManWriteConcat( Bac_Ntk_t * p, int iStart, int nObjs )
{
    Vec_Str_t * vStr = p->pDesign->vOut; 
    assert( nObjs >= 1 );
    if ( nObjs == 1 )
    {
        Bac_ManWriteSig( p, iStart );
        return;
    }
    Vec_StrPrintStr( vStr, "{" );
    if ( Bac_ObjIsBo(p, iStart) ) // box output
    {
        int i;
        for ( i = iStart + nObjs - 1; i >= iStart; i-- )
        {
            if ( Bac_ObjNameType(p, i) == BAC_NAME_INDEX )
                continue;
            if ( Vec_StrEntryLast(vStr) != '{' )
                Vec_StrPrintStr( vStr, ", " );
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, i) );
        }
    }
    else if ( Bac_ObjIsBi(p, iStart) ) // box input
    {
        int e, b, k, NameId;
        for ( e = iStart - nObjs + 1; e <= iStart; )
        {
            if ( Vec_StrEntryLast(vStr) != '{' )
                Vec_StrPrintStr( vStr, ", " );
            // write constant
            if ( Bac_ObjGetConst(p, Bac_ObjFanin(p, e)) )
            {
                int fBinary = Bac_ObjIsConstBin(p, Bac_ObjFanin(p, e)-1);                
                for ( b = e + 1; b <= iStart; b++ )
                {
                    if ( !Bac_ObjGetConst(p, Bac_ObjFanin(p, b)) )
                        break;
                    if ( !Bac_ObjIsConstBin(p, Bac_ObjFanin(p, b)-1) )
                        fBinary = 0;
                }
                Vec_StrPrintNum( vStr, b - e );
                if ( fBinary && b - e > 8 ) // write hex if more than 8 bits
                {
                    int Digit = 0, nBits = ((b - e) & 3) ? (b - e) & 3 : 4;
                    Vec_StrPrintStr( vStr, "\'h" );
                    for ( k = e; k < b; k++ )
                    {
                        Digit = 2*Digit + Bac_ObjGetConst(p, Bac_ObjFanin(p, k)) - BAC_BOX_CF;
                        assert( Digit < 16 );
                        if ( --nBits == 0 )
                        {
                            Vec_StrPush( vStr, (char)(Digit < 10 ? '0' + Digit : 'a' + Digit - 10) );
                            nBits = 4;
                            Digit = 0;
                        }
                    }
                    assert( nBits == 4 );
                    assert( Digit == 0 );
                }
                else
                {
                    Vec_StrPrintStr( vStr, "\'b" );
                    for ( k = e; k < b; k++ )
                        Bac_ManWriteConstBit( p, Bac_ObjFanin(p, k), 0 );
                }
                e = b;
                continue;
            }
            // try replication
            for ( b = e + 1; b <= iStart; b++ )
                if ( Bac_ObjFanin(p, b) != Bac_ObjFanin(p, e) )
                    break;
            if ( b > e + 2 ) // more than two
            {
                Vec_StrPrintNum( vStr, b - e );
                Vec_StrPrintStr( vStr, "{" );
                Bac_ManWriteSig( p, e );
                Vec_StrPrintStr( vStr, "}" );
                e = b;
                continue;
            }
            NameId = Bac_ObjName(p, Bac_ObjFanin(p, e));
            if ( Bac_NameType(NameId) == BAC_NAME_BIN )
            {
                Bac_ManWriteVar( p, Abc_Lit2Var2(NameId) );
                e++;
                continue;
            }
            // find end of the slice
            for ( b = e + 1; b <= iStart; b++ )
                if ( Bac_ObjFanin(p, e) - Bac_ObjFanin(p, b) != b - e )
                    break;
            // write signal name
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, Bac_ObjFanin(p, e)) );
            if ( b == e + 1 ) // literal
                Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, Bac_ObjFanin(p, e)), -1 );
            else // slice or complete variable
            {
                // consider first variable of the slice
                int f = Bac_ObjFanin( p, b-1 );
                assert( Bac_ObjNameType(p, f) != BAC_NAME_BIN );
                if ( Bac_ObjNameType(p, f) == BAC_NAME_INDEX || Bac_ObjGetRange(p, f) != b - e ) // slice
                    Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, f), Bac_ManFindRealIndex(p, Bac_ObjFanin(p, e)) );
                // else this is complete variable
            }
            e = b;
        }
    }
    else assert( 0 );
    Vec_StrPrintStr( vStr, "}" );
}